

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall
crnlib::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uint in_EDX;
  uint32 local_18;
  uint total_syms_local;
  bool param_1_local;
  adaptive_arith_data_model *this_local;
  
  if (in_EDX != 0) {
    if ((in_EDX < 2) || (bVar1 = math::is_power_of_2(in_EDX), local_18 = in_EDX, !bVar1)) {
      local_18 = math::next_pow2(in_EDX);
    }
    this->m_total_syms = local_18;
    vector<crnlib::adaptive_bit_model>::resize(&this->m_probs,this->m_total_syms,false);
    return extraout_EAX_00;
  }
  clear(this);
  return extraout_EAX;
}

Assistant:

void adaptive_arith_data_model::init(bool, uint total_syms)
    {
        if (!total_syms)
        {
            clear();
            return;
        }

        if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
        {
            total_syms = math::next_pow2(total_syms);
        }

        m_total_syms = total_syms;

        m_probs.resize(m_total_syms);
    }